

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  uv_process_options_t *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  __sighandler_t p_Var5;
  int *piVar7;
  ulong extraout_RAX;
  pthread_t __th;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int fd;
  cpu_set_t cpuset;
  sigset_t signewset;
  ulong uVar6;
  
  iVar9 = 1;
  do {
    if ((iVar9 != 9) && (iVar9 != 0x13)) {
      if (iVar9 == 0x20) {
        if ((options->flags & 8) != 0) {
          setsid();
        }
        uVar6 = 0;
        if (0 < stdio_count) {
          uVar6 = (ulong)(uint)stdio_count;
        }
        uVar8 = 0;
        break;
      }
      p_Var5 = signal(iVar9,(__sighandler_t)0x0);
      if (p_Var5 == (__sighandler_t)0xffffffffffffffff) goto LAB_0020f0ef;
    }
    iVar9 = iVar9 + 1;
  } while( true );
LAB_0020f0c3:
  if (uVar6 == uVar8) goto LAB_0020f0f7;
  if ((uint)pipes[uVar8][1] < uVar8) {
    iVar9 = fcntl(pipes[uVar8][1],0x406,(ulong)(uint)stdio_count);
    pipes[uVar8][1] = iVar9;
    if (iVar9 == -1) goto LAB_0020f0ef;
  }
  uVar8 = uVar8 + 1;
  goto LAB_0020f0c3;
LAB_0020f0ef:
  uv__write_errno(error_fd);
LAB_0020f0f7:
  iVar9 = -1;
  iVar4 = 0;
  do {
    if (stdio_count <= iVar4) {
      pipes = (int (*) [2])options;
      if ((options->cwd != (char *)0x0) && (iVar4 = chdir(options->cwd), iVar4 != 0))
      goto LAB_0020f263;
      uVar2 = options->flags;
      if ((uVar2 & 3) != 0) {
        piVar7 = __errno_location();
        iVar9 = *piVar7;
        setgroups(0,(__gid_t *)0x0);
        *piVar7 = iVar9;
        uVar2 = options->flags;
      }
      iVar9 = error_fd;
      if ((uVar2 & 2) != 0) {
        iVar4 = setgid(options->gid);
        if (iVar4 != 0) goto LAB_0020f25b;
        uVar2 = options->flags;
      }
      if (((uVar2 & 1) != 0) && (iVar4 = setuid(options->uid), iVar4 != 0)) goto LAB_0020f25b;
      if (options->cpumask != (char *)0x0) goto LAB_0020f277;
      goto LAB_0020f21a;
    }
    iVar3 = pipes[iVar4][1];
    if (iVar3 < 0) {
      if (iVar4 < 3) {
        uv__close_nocheckstdio(iVar4);
        iVar3 = open("/dev/null",(uint)(iVar4 != 0) * 2);
        if (iVar3 < 0) goto LAB_0020f263;
        fd = iVar4;
        iVar10 = iVar3;
        if (iVar4 != iVar3) goto LAB_0020f16f;
        goto LAB_0020f198;
      }
    }
    else {
      iVar10 = -1;
      if (iVar4 == iVar3) {
        uVar2 = uv__cloexec(iVar4,0);
        uVar6 = (ulong)uVar2;
        iVar10 = -1;
        puVar1 = (uv_process_options_t *)pipes;
        iVar3 = error_fd;
        if (uVar2 != 0) {
          while( true ) {
            while( true ) {
              options = puVar1;
              uv__write_int(iVar3,(int)uVar6);
LAB_0020f277:
              uVar2 = uv_cpumask_size();
              if (options->cpumask_size < (ulong)(long)(int)uVar2) {
                __assert_fail("options->cpumask_size >= (size_t)cpumask_size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                              ,400,
                              "void uv__process_child_init(const uv_process_options_t *, int, int (*)[2], int)"
                             );
              }
              cpuset.__bits[0xe] = 0;
              cpuset.__bits[0xf] = 0;
              cpuset.__bits[0xc] = 0;
              cpuset.__bits[0xd] = 0;
              cpuset.__bits[10] = 0;
              cpuset.__bits[0xb] = 0;
              cpuset.__bits[8] = 0;
              cpuset.__bits[9] = 0;
              cpuset.__bits[6] = 0;
              cpuset.__bits[7] = 0;
              cpuset.__bits[4] = 0;
              cpuset.__bits[5] = 0;
              cpuset.__bits[2] = 0;
              cpuset.__bits[3] = 0;
              cpuset.__bits[0] = 0;
              cpuset.__bits[1] = 0;
              uVar8 = 0;
              uVar6 = (ulong)uVar2;
              if ((int)uVar2 < 1) {
                uVar6 = uVar8;
              }
              for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
                if ((uVar8 < 0x400) && (options->cpumask[uVar8] != '\0')) {
                  cpuset.__bits[uVar8 >> 6] = cpuset.__bits[uVar8 >> 6] | 1L << ((byte)uVar8 & 0x3f)
                  ;
                }
              }
              __th = pthread_self();
              iVar4 = pthread_setaffinity_np(__th,0x80,(cpu_set_t *)&cpuset);
              if (iVar4 == 0) break;
              uVar6 = (ulong)(uint)-iVar4;
              puVar1 = options;
              iVar3 = iVar9;
            }
LAB_0020f21a:
            if (options->env != (char **)0x0) {
              _environ = options->env;
            }
            sigemptyset((sigset_t *)&signewset);
            iVar4 = sigprocmask(2,(sigset_t *)&signewset,(sigset_t *)0x0);
            if (iVar4 != 0) break;
            execvp(options->file,options->args);
            pipes = (int (*) [2])options;
LAB_0020f25b:
            uv__write_errno(iVar9);
LAB_0020f263:
            uv__write_errno(error_fd);
            uVar6 = extraout_RAX;
            puVar1 = (uv_process_options_t *)pipes;
            iVar3 = error_fd;
          }
          abort();
        }
      }
      else {
LAB_0020f16f:
        iVar4 = dup2(iVar3,iVar4);
        if (iVar4 == -1) goto LAB_0020f263;
      }
      fd = iVar10;
      if ((iVar10 == -1) && (iVar4 < 3)) {
        uv__nonblock_fcntl(iVar4,0);
        fd = -1;
      }
LAB_0020f198:
      if (stdio_count <= fd) {
        uv__close(fd);
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  sigset_t signewset;
  int close_fd;
  int use_fd;
  int fd;
  int n;
#ifndef CMAKE_BOOTSTRAP
#if defined(__linux__) || defined(__FreeBSD__)
  int r;
  int i;
  int cpumask_size;
  uv__cpu_set_t cpuset;
#endif
#endif

  /* Reset signal disposition first. Use a hard-coded limit because NSIG is not
   * fixed on Linux: it's either 32, 34 or 64, depending on whether RT signals
   * are enabled. We are not allowed to touch RT signal handlers, glibc uses
   * them internally.
   */
  for (n = 1; n < 32; n += 1) {
    if (n == SIGKILL || n == SIGSTOP)
      continue;  /* Can't be changed. */

#if defined(__HAIKU__)
    if (n == SIGKILLTHR)
      continue;  /* Can't be changed. */
#endif

    if (SIG_ERR != signal(n, SIG_DFL))
      continue;

    uv__write_errno(error_fd);
  }

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
#ifdef F_DUPFD_CLOEXEC /* POSIX 2008 */
    pipes[fd][1] = fcntl(use_fd, F_DUPFD_CLOEXEC, stdio_count);
#else
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
#endif
    if (pipes[fd][1] == -1)
      uv__write_errno(error_fd);
#ifndef F_DUPFD_CLOEXEC /* POSIX 2008 */
    n = uv__cloexec(pipes[fd][1], 1);
    if (n)
      uv__write_int(error_fd, n);
#endif
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = -1;
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* Redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set. */
        uv__close_nocheckstdio(fd); /* Free up fd, if it happens to be open. */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd < 0)
          uv__write_errno(error_fd);
      }
    }

    if (fd == use_fd) {
      if (close_fd == -1) {
        n = uv__cloexec(use_fd, 0);
        if (n)
          uv__write_int(error_fd, n);
      }
    }
    else {
      fd = dup2(use_fd, fd);
    }

    if (fd == -1)
      uv__write_errno(error_fd);

    if (fd <= 2 && close_fd == -1)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd))
    uv__write_errno(error_fd);

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid))
    uv__write_errno(error_fd);

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid))
    uv__write_errno(error_fd);

#ifndef CMAKE_BOOTSTRAP
#if defined(__linux__) || defined(__FreeBSD__)
  if (options->cpumask != NULL) {
    cpumask_size = uv_cpumask_size();
    assert(options->cpumask_size >= (size_t)cpumask_size);

    CPU_ZERO(&cpuset);
    for (i = 0; i < cpumask_size; ++i) {
      if (options->cpumask[i]) {
        CPU_SET(i, &cpuset);
      }
    }

    r = -pthread_setaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
    if (r != 0) {
      uv__write_int(error_fd, r);
      _exit(127);
    }
  }
#endif
#endif

  if (options->env != NULL)
    environ = options->env;

  /* Reset signal mask just before exec. */
  sigemptyset(&signewset);
  if (sigprocmask(SIG_SETMASK, &signewset, NULL) != 0)
    abort();

#ifdef __MVS__
  execvpe(options->file, options->args, environ);
#else
  execvp(options->file, options->args);
#endif

  uv__write_errno(error_fd);
}